

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

Opnd * __thiscall IR::Instr::ReplaceSrc1(Instr *this,Opnd *newSrc)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  Opnd *this_00;
  undefined4 *puVar4;
  
  this_00 = UnlinkSrc1(this);
  Opnd::Free(this_00,this->m_func);
  if (this->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_004bf24c;
    *puVar4 = 0;
  }
  func = this->m_func;
  if (newSrc->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_004bf24c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = newSrc->field_0xb;
  if ((bVar3 & 2) != 0) {
    newSrc = Opnd::Copy(newSrc,func);
    bVar3 = newSrc->field_0xb;
  }
  newSrc->field_0xb = bVar3 | 2;
  this->m_src1 = newSrc;
  return newSrc;
}

Assistant:

Opnd *
Instr::ReplaceSrc1(Opnd * newSrc)
{
    this->FreeSrc1();
    return this->SetSrc1(newSrc);
}